

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O2

void __thiscall xLearn::Checker::check_conflict_predict(Checker *this,HyperParam *hyper_param)

{
  allocator local_31;
  string local_30;
  
  if ((hyper_param->sign == true) && (hyper_param->sigmoid == true)) {
    std::__cxx11::string::string
              ((string *)&local_30,
               "Both of --sign and --sigmoid have been set. xLearn has already disable --sign and --sigmoid."
               ,&local_31);
    Color::print_warning(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    hyper_param->sign = false;
    hyper_param->sigmoid = false;
  }
  return;
}

Assistant:

void Checker::check_conflict_predict(HyperParam& hyper_param) {
  if (hyper_param.sign && hyper_param.sigmoid) {
    Color::print_warning("Both of --sign and --sigmoid have been set. "
                         "xLearn has already disable --sign and --sigmoid.");
    hyper_param.sign = false;
    hyper_param.sigmoid = false;
  }
}